

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O3

Status * __thiscall
draco::ObjDecoder::DecodeFromBuffer
          (Status *__return_storage_ptr__,ObjDecoder *this,DecoderBuffer *buffer,
          PointCloud *out_point_cloud)

{
  this->out_point_cloud_ = out_point_cloud;
  DecoderBuffer::Init(&this->buffer_,buffer->data_ + buffer->pos_,buffer->data_size_ - buffer->pos_)
  ;
  DecodeInternal(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Status ObjDecoder::DecodeFromBuffer(DecoderBuffer *buffer,
                                    PointCloud *out_point_cloud) {
  out_point_cloud_ = out_point_cloud;
  buffer_.Init(buffer->data_head(), buffer->remaining_size());
  return DecodeInternal();
}